

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O0

uint32_t __thiscall
duckdb::ParquetWriter::WriteData(ParquetWriter *this,const_data_ptr_t buffer,uint32_t buffer_size)

{
  bool bVar1;
  ParquetEncryptionConfig *this_00;
  element_type *this_01;
  size_t in_RCX;
  uint in_EDX;
  int in_ESI;
  EncryptionUtil *in_stack_00000010;
  string *in_stack_00000018;
  uint32_t in_stack_00000024;
  const_data_ptr_t in_stack_00000028;
  TProtocol *in_stack_00000030;
  TProtocol *in_stack_ffffffffffffff88;
  __shared_ptr_access<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff90;
  undefined4 local_4;
  
  bVar1 = duckdb::shared_ptr::operator_cast_to_bool
                    ((shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)0x6bda05);
  if (bVar1) {
    std::
    __shared_ptr_access<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*(in_stack_ffffffffffffff90);
    this_00 = shared_ptr<duckdb::ParquetEncryptionConfig,_true>::operator->
                        ((shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)
                         in_stack_ffffffffffffff90);
    ParquetEncryptionConfig::GetFooterKey_abi_cxx11_(this_00);
    shared_ptr<duckdb::EncryptionUtil,_true>::operator*
              ((shared_ptr<duckdb::EncryptionUtil,_true> *)in_stack_ffffffffffffff90);
    local_4 = ParquetCrypto::WriteData
                        (in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000018,
                         in_stack_00000010);
  }
  else {
    std::
    __shared_ptr_access<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x6bda91);
    duckdb_apache::thrift::protocol::TProtocol::getTransport(in_stack_ffffffffffffff88);
    this_01 = std::
              __shared_ptr_access<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x6bdaad);
    duckdb_apache::thrift::transport::TTransport::write(this_01,in_ESI,(void *)(ulong)in_EDX,in_RCX)
    ;
    std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::~shared_ptr
              ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)0x6bdaca);
    local_4 = in_EDX;
  }
  return local_4;
}

Assistant:

uint32_t ParquetWriter::WriteData(const const_data_ptr_t buffer, const uint32_t buffer_size) {
	if (encryption_config) {
		return ParquetCrypto::WriteData(*protocol, buffer, buffer_size, encryption_config->GetFooterKey(),
		                                *encryption_util);
	} else {
		protocol->getTransport()->write(buffer, buffer_size);
		return buffer_size;
	}
}